

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFileEqnStorage.cpp
# Opt level: O1

void __thiscall
TPZFileEqnStorage<std::complex<long_double>_>::TPZFileEqnStorage
          (TPZFileEqnStorage<std::complex<long_double>_> *this)

{
  char *pcVar1;
  int __fd;
  FILE *__s;
  int zero;
  undefined4 local_34;
  
  (this->super_TPZSavable)._vptr_TPZSavable = (_func_int **)&PTR__TPZFileEqnStorage_019a6b98;
  TPZStack<long,_10>::TPZStack(&this->fBlockPos);
  (this->fFileName)._M_dataplus._M_p = (pointer)&(this->fFileName).field_2;
  (this->fFileName)._M_string_length = 0;
  (this->fFileName).field_2._M_local_buf[0] = '\0';
  builtin_strncpy(filenamestorage + 0x10,"talXXXXXX",10);
  builtin_strncpy(filenamestorage,"/tmp/binary_fron",0x10);
  __fd = mkstemp(filenamestorage);
  this->fNumBlocks = 0;
  this->fCurrentBlock = 0;
  this->fCurBlockPosition = -1;
  this->fNumHeaders = 0x14;
  pcVar1 = (char *)(this->fFileName)._M_string_length;
  strlen(filenamestorage);
  std::__cxx11::string::_M_replace((ulong)&this->fFileName,0,pcVar1,0x1a5b1b0);
  __s = fdopen(__fd,"wb");
  this->fIOStream = (FILE *)__s;
  local_34 = 0;
  fwrite(&this->fNumHeaders,4,1,__s);
  fwrite(&local_34,4,1,(FILE *)this->fIOStream);
  return;
}

Assistant:

TPZFileEqnStorage<TVar>::TPZFileEqnStorage()
: TPZRegisterClassId(&TPZFileEqnStorage<TVar>::ClassId)
{
	strcpy(filenamestorage, "/tmp/binary_frontalXXXXXX");
	int fdtmp = -1;
#ifdef WIN32
	_mktemp(filenamestorage);
#else
	fdtmp = mkstemp(filenamestorage); //returns file description for tmp file
#endif
	
	fCurBlockPosition = -1;
	fNumBlocks=0;
	fCurrentBlock=0;
	fNumHeaders=20;
	
	fFileName = filenamestorage;
#ifdef WIN32
	fIOStream = fopen(filenamestorage,"wb"); //open for writing
#else
	fIOStream = fdopen(fdtmp,"wb"); //open for writing
#endif
	/**
	 *Writes NumHeaders and NumBlocks information in
	 *the two initial positions on fIOStream
	 */
	int zero = 0;
	fwrite(&fNumHeaders,sizeof(int),1,fIOStream);
	//cout << ftell(fIOStream) << endl;
	fwrite(&zero,sizeof(int),1,fIOStream);
}